

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::ShutdownIdleDecommit(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachPageAllocator<Memory::HeapInfo::ShutdownIdleDecommit()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::ShutdownIdleDecommit()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->ShutdownIdleDecommit();
    });
}